

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::UnknownFieldParserHelper::ParseGroup
          (UnknownFieldParserHelper *this,uint32 num,char *ptr,ParseContext *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  uint32 uVar4;
  char *pcVar5;
  char *pcVar6;
  UnknownFieldParserHelper local_28;
  UnknownFieldParserHelper child;
  
  local_28.unknown_ = UnknownFieldSet::AddGroup(this->unknown_,num);
  iVar3 = ctx->depth_;
  ctx->depth_ = iVar3 + -1;
  if (iVar3 < 1) {
    pcVar6 = (char *)0x0;
  }
  else {
    ctx->group_depth_ = ctx->group_depth_ + 1;
    pcVar5 = WireFormatParser<google::protobuf::internal::UnknownFieldParserHelper>
                       (&local_28,ptr,ctx);
    uVar1 = ctx->depth_;
    uVar2 = ctx->group_depth_;
    ctx->depth_ = uVar1 + 1;
    ctx->group_depth_ = uVar2 + -1;
    uVar4 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    pcVar6 = (char *)0x0;
    if (uVar4 == num * 8 + 3) {
      pcVar6 = pcVar5;
    }
  }
  return pcVar6;
}

Assistant:

const char* ParseGroup(uint32 num, const char* ptr, ParseContext* ctx) {
    UnknownFieldParserHelper child(unknown_->AddGroup(num));
    return ctx->ParseGroup(&child, ptr, num * 8 + 3);
  }